

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O2

complex<double> * c8mat_test_inverse(int n)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  complex<double> *pcVar4;
  long lVar5;
  ulong uVar6;
  undefined *puVar7;
  ulong uVar8;
  undefined *puVar9;
  long lVar10;
  
  pcVar4 = c8mat_test(n);
  lVar5 = 0;
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  puVar7 = pcVar4->_M_value + 8;
  for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    puVar9 = pcVar4->_M_value + 8;
    for (lVar10 = 0; lVar5 != lVar10; lVar10 = lVar10 + 0x10) {
      uVar1 = *(undefined8 *)(puVar7 + lVar10 + -8);
      uVar2 = *(ulong *)(puVar7 + lVar10);
      uVar3 = *(ulong *)(puVar9 + lVar5);
      *(undefined8 *)(puVar7 + lVar10 + -8) = *(undefined8 *)(puVar9 + lVar5 + -8);
      *(ulong *)(puVar7 + lVar10) = uVar3 ^ 0x8000000000000000;
      *(undefined8 *)(puVar9 + lVar5 + -8) = uVar1;
      *(ulong *)(puVar9 + lVar5) = uVar2 ^ 0x8000000000000000;
      puVar9 = puVar9 + (long)n * 0x10;
    }
    puVar7 = puVar7 + (long)n * 0x10;
    lVar5 = lVar5 + 0x10;
  }
  return pcVar4;
}

Assistant:

complex <double> *c8mat_test_inverse ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    C8MAT_TEST_INVERSE returns the inverse of a test matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Output, complex <double> C8MAT_TEST_INVERSE[N*N], the matrix.
//
{
  complex <double> *a;
  int i;
  int j;
  complex <double> t;

  a = c8mat_test ( n );

  for ( j = 0; j < n; j++ )
  {
    for ( i = 0; i < j; i++ )
    {
      t        = conj ( a[i+j*n] );
      a[i+j*n] = conj ( a[j+i*n] );
      a[j+i*n] = t;
    }
  }
  return a;
}